

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

unique_pointer<const_void> __thiscall
pstore::database::getu(database *this,address addr,size_t size,bool initialized)

{
  bool bVar1;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Var2;
  undefined7 in_register_00000009;
  void *extraout_RDX;
  unique_pointer<const_void> uVar4;
  address local_38;
  _Head_base<0UL,_const_void_*,_false> _Var3;
  
  local_38.a_ = size;
  check_get_params((database *)addr.a_,(address)size,CONCAT71(in_register_00000009,initialized),
                   false);
  bVar1 = storage::request_spans_regions
                    ((storage *)(addr.a_ + 8),&local_38,CONCAT71(in_register_00000009,initialized));
  if (bVar1) {
    uVar4 = get_spanningu(this,addr,local_38.a_,initialized);
    _Var3._M_head_impl =
         uVar4._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
         super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
         super__Head_base<0UL,_const_void_*,_false>._M_head_impl;
  }
  else {
    _Var2._M_head_impl =
         (array<pstore::sat_entry,_65536UL> *)
         storage::address_to_raw_pointer_impl<pstore::storage_const,unsigned_char_const*>
                   ((storage *)(addr.a_ + 8),local_38);
    this->_vptr_database = (_func_int **)deleter_nop<void_const>;
    (this->storage_).sat_._M_t.
    super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
         _Var2._M_head_impl;
    _Var3._M_head_impl = extraout_RDX;
  }
  uVar4._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
  super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
  super__Head_base<0UL,_const_void_*,_false>._M_head_impl = _Var3._M_head_impl;
  uVar4._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
  super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
  super__Tuple_impl<1UL,_void_(*)(const_void_*)>.
  super__Head_base<1UL,_void_(*)(const_void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(const_void_*),_false>)
       (_Head_base<1UL,_void_(*)(const_void_*),_false>)this;
  return (unique_pointer<const_void>)
         uVar4._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
         super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>;
}

Assistant:

auto database::getu (address addr, std::size_t size, bool initialized) const
        -> unique_pointer<void const> {
        this->check_get_params (addr, size, false);
        if (storage_.request_spans_regions (addr, size)) {
            return this->get_spanningu (addr, size, initialized);
        }
        return {storage_.address_to_raw_pointer (addr), deleter_nop<void const>};
    }